

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O2

void Diffusion::setBeta(MLEBABecLap *op,MultiFab **beta,int betaComp,int nComp)

{
  Array<const_MultiFab_*,_3> local_4c8;
  Array<MultiFab,_3> bcoeffs;
  
  amrex::MultiFab::MultiFab(bcoeffs._M_elems,*beta,make_alias,betaComp,nComp);
  amrex::MultiFab::MultiFab(bcoeffs._M_elems + 1,beta[1],make_alias,betaComp,nComp);
  amrex::MultiFab::MultiFab(bcoeffs._M_elems + 2,beta[2],make_alias,betaComp,nComp);
  local_4c8._M_elems[0] = bcoeffs._M_elems;
  local_4c8._M_elems[1] = bcoeffs._M_elems + 1;
  local_4c8._M_elems[2] = bcoeffs._M_elems + 2;
  amrex::MLEBABecLap::setBCoeffs(op,0,&local_4c8,FaceCentroid);
  std::array<amrex::MultiFab,_3UL>::~array(&bcoeffs);
  return;
}

Assistant:

void
Diffusion::setBeta(MLEBABecLap&           op,
                   const MultiFab* const* beta,
                   int                    betaComp,
                   int                    nComp)
{
    Array<MultiFab,AMREX_SPACEDIM> bcoeffs{
    AMREX_D_DECL(MultiFab(*beta[0], amrex::make_alias, betaComp, nComp),
                 MultiFab(*beta[1], amrex::make_alias, betaComp, nComp),
                 MultiFab(*beta[2], amrex::make_alias, betaComp, nComp) ) };

    op.setBCoeffs(0, amrex::GetArrOfConstPtrs(bcoeffs), MLLinOp::Location::FaceCentroid);
}